

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetwork::MergeFrom(NeuralNetwork *this,NeuralNetwork *from)

{
  void *pvVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  void **our_elems;
  NetworkUpdateParameters *this_00;
  int iVar4;
  NetworkUpdateParameters *from_00;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x85d);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x61d);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_61,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  iVar4 = (from->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar2 = (from->preprocessing_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->preprocessing_).super_RepeatedPtrFieldBase,iVar4);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
              (&(this->preprocessing_).super_RepeatedPtrFieldBase,our_elems,pRVar2->elements,iVar4,
               ((this->preprocessing_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
    (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar2 = (this->preprocessing_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2->allocated_size < iVar4) {
      pRVar2->allocated_size = iVar4;
    }
  }
  from_00 = from->updateparams_;
  if (from_00 != (NetworkUpdateParameters *)0x0 &&
      from != (NeuralNetwork *)&_NeuralNetwork_default_instance_) {
    this_00 = this->updateparams_;
    if (this_00 == (NetworkUpdateParameters *)0x0) {
      this_00 = (NetworkUpdateParameters *)operator_new(0x50);
      NetworkUpdateParameters::NetworkUpdateParameters(this_00);
      this->updateparams_ = this_00;
      from_00 = from->updateparams_;
    }
    if (from_00 == (NetworkUpdateParameters *)0x0) {
      from_00 = (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this_00,from_00);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  return;
}

Assistant:

void NeuralNetwork::MergeFrom(const NeuralNetwork& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetwork)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (from.has_updateparams()) {
    mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from.updateparams());
  }
  if (from.arrayinputshapemapping() != 0) {
    set_arrayinputshapemapping(from.arrayinputshapemapping());
  }
  if (from.imageinputshapemapping() != 0) {
    set_imageinputshapemapping(from.imageinputshapemapping());
  }
}